

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O1

bool __thiscall crnlib::dds_comp::convert_to_dxt(dds_comp *this,crn_comp_params *params)

{
  crn_uint32 cVar1;
  code *pcVar2;
  qdxt_state *this_00;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  cVar1 = params->m_quality_level;
  if ((cVar1 == 0xff) || (params->m_format == cCRNFmtDXT3)) {
    mipmapped_texture::operator=(&this->m_packed_tex,&this->m_src_tex);
    bVar3 = mipmapped_texture::convert
                      (&this->m_packed_tex,this->m_pixel_fmt,false,&this->m_pack_params);
    if (!bVar3) {
      return false;
    }
LAB_0016a91f:
    bVar3 = true;
  }
  else {
    bVar3 = (bool)((byte)params->m_flags >> 1 & 1);
    (this->m_q1_params).m_quality_level = cVar1;
    (this->m_q1_params).m_hierarchical = bVar3;
    (this->m_q5_params).m_quality_level = cVar1;
    (this->m_q5_params).m_hierarchical = bVar3;
    if (this->m_pQDXT_state == (qdxt_state *)0x0) {
      this_00 = (qdxt_state *)crnlib_malloc(0x5dc8);
      mipmapped_texture::qdxt_state::qdxt_state(this_00,&this->m_task_pool);
      this->m_pQDXT_state = this_00;
      if (params->m_pProgress_func != (crn_progress_callback_func)0x0) {
        (this->m_q1_params).m_pProgress_func = progress_callback_func_phase_0;
        (this->m_q1_params).m_pProgress_data = params;
        (this->m_q5_params).m_pProgress_func = progress_callback_func_phase_0;
        (this->m_q5_params).m_pProgress_data = params;
      }
      bVar3 = mipmapped_texture::qdxt_pack_init
                        (&this->m_src_tex,this_00,&this->m_packed_tex,&this->m_q1_params,
                         &this->m_q5_params,this->m_pixel_fmt,false);
      if (bVar3) {
        if (params->m_pProgress_func != (crn_progress_callback_func)0x0) {
          lVar4 = 0x1020;
          pcVar2 = progress_callback_func_phase_1;
          lVar5 = 0x9f8;
          params = (crn_comp_params *)progress_callback_func_phase_1;
          goto LAB_0016a8f6;
        }
        goto LAB_0016a8fe;
      }
    }
    else {
      if (params->m_pProgress_func != (crn_progress_callback_func)0x0) {
        pcVar2 = progress_callback_func;
        (this->m_q1_params).m_pProgress_func = progress_callback_func;
        (this->m_q1_params).m_pProgress_data = params;
        lVar4 = 0x1028;
        lVar5 = 0x1020;
LAB_0016a8f6:
        *(code **)((long)&(this->super_itexture_comp)._vptr_itexture_comp + lVar5) = pcVar2;
        *(crn_comp_params **)((long)&(this->super_itexture_comp)._vptr_itexture_comp + lVar4) =
             params;
      }
LAB_0016a8fe:
      bVar3 = mipmapped_texture::qdxt_pack
                        (&this->m_src_tex,this->m_pQDXT_state,&this->m_packed_tex,&this->m_q1_params
                         ,&this->m_q5_params);
      if (bVar3) goto LAB_0016a91f;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool dds_comp::convert_to_dxt(const crn_comp_params& params)
    {
        if ((params.m_quality_level == cCRNMaxQualityLevel) || (params.m_format == cCRNFmtDXT3))
        {
            m_packed_tex = m_src_tex;
            if (!m_packed_tex.convert(m_pixel_fmt, false, m_pack_params))
            {
                return false;
            }
        }
        else
        {
            const bool hierarchical = (params.m_flags & cCRNCompFlagHierarchical) != 0;

            m_q1_params.m_quality_level = params.m_quality_level;
            m_q1_params.m_hierarchical = hierarchical;

            m_q5_params.m_quality_level = params.m_quality_level;
            m_q5_params.m_hierarchical = hierarchical;

            if (!m_pQDXT_state)
            {
                m_pQDXT_state = crnlib_new<mipmapped_texture::qdxt_state>(m_task_pool);

                if (params.m_pProgress_func)
                {
                    m_q1_params.m_pProgress_func = progress_callback_func_phase_0;
                    m_q1_params.m_pProgress_data = (void*)&params;
                    m_q5_params.m_pProgress_func = progress_callback_func_phase_0;
                    m_q5_params.m_pProgress_data = (void*)&params;
                }

                if (!m_src_tex.qdxt_pack_init(*m_pQDXT_state, m_packed_tex, m_q1_params, m_q5_params, m_pixel_fmt, false))
                {
                    return false;
                }

                if (params.m_pProgress_func)
                {
                    m_q1_params.m_pProgress_func = progress_callback_func_phase_1;
                    m_q5_params.m_pProgress_func = progress_callback_func_phase_1;
                }
            }
            else
            {
                if (params.m_pProgress_func)
                {
                    m_q1_params.m_pProgress_func = progress_callback_func;
                    m_q1_params.m_pProgress_data = (void*)&params;
                    m_q5_params.m_pProgress_func = progress_callback_func;
                    m_q5_params.m_pProgress_data = (void*)&params;
                }
            }

            if (!m_src_tex.qdxt_pack(*m_pQDXT_state, m_packed_tex, m_q1_params, m_q5_params))
            {
                return false;
            }
        }

        return true;
    }